

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

unique_ptr<char[],_std::default_delete<char[]>_> __thiscall
QUtil::make_unique_cstr(QUtil *this,string *str)

{
  pointer pcVar1;
  long lVar2;
  void *__src;
  size_t __n;
  string *str_local;
  __array *result;
  
  std::__cxx11::string::length();
  std::make_unique<char[]>((size_t)this);
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
  lVar2 = std::__cxx11::string::length();
  pcVar1[lVar2] = '\0';
  pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
  __src = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::length();
  memcpy(pcVar1,__src,__n);
  return (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char[]>
QUtil::make_unique_cstr(std::string const& str)
{
    auto result = std::make_unique<char[]>(str.length() + 1);
    // Use memcpy in case string contains nulls
    result.get()[str.length()] = '\0';
    memcpy(result.get(), str.c_str(), str.length());
    return result;
}